

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

void __thiscall
Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::Release
          (RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *this)

{
  SerializedResourceSignatureImpl *pSVar1;
  char (*in_RCX) [26];
  string msg;
  string local_30;
  
  pSVar1 = this->m_pObject;
  if (pSVar1 != (SerializedResourceSignatureImpl *)0x0) {
    if ((pSVar1->super_ObjectBase<Diligent::IPipelineResourceSignature>).
        super_RefCountedObject<Diligent::IPipelineResourceSignature>.m_pRefCounters ==
        (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_30,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"Release",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
                 ,0x229);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::ReleaseStrongRef<Diligent::RefCountersImpl::ReleaseStrongRef()::_lambda()_1_>
              ((pSVar1->super_ObjectBase<Diligent::IPipelineResourceSignature>).
               super_RefCountedObject<Diligent::IPipelineResourceSignature>.m_pRefCounters,
               (anon_class_1_0_00000001 *)&local_30);
    this->m_pObject = (SerializedResourceSignatureImpl *)0x0;
  }
  return;
}

Assistant:

void Release() noexcept
    {
        if (m_pObject)
        {
            m_pObject->Release();
            m_pObject = nullptr;
        }
    }